

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

size_t phosg::init_bmp_header
                 (WindowsBitmapHeader *header,ssize_t width,ssize_t height,bool has_alpha,
                 size_t pixel_bytes,size_t row_padding_bytes)

{
  unsigned_short uVar1;
  long lVar2;
  uint uVar3;
  uint local_148;
  undefined1 *local_120;
  same_endian<unsigned_int,_unsigned_int> local_118;
  same_endian<unsigned_int,_unsigned_int> local_114;
  same_endian<unsigned_int,_unsigned_int> local_110;
  same_endian<unsigned_int,_unsigned_int> local_10c;
  same_endian<unsigned_int,_unsigned_int> local_108;
  same_endian<unsigned_int,_unsigned_int> local_104;
  same_endian<unsigned_int,_unsigned_int> local_100;
  same_endian<unsigned_int,_unsigned_int> local_fc;
  same_endian<int,_int> local_f8;
  same_endian<int,_int> local_f4;
  same_endian<unsigned_int,_unsigned_int> local_f0;
  same_endian<unsigned_int,_unsigned_int> local_ec;
  same_endian<unsigned_short,_unsigned_short> local_e8;
  same_endian<unsigned_short,_unsigned_short> local_e6;
  same_endian<int,_int> local_e4;
  same_endian<int,_int> local_e0;
  same_endian<unsigned_int,_unsigned_int> local_dc;
  same_endian<unsigned_int,_unsigned_int> local_d8;
  same_endian<unsigned_short,_unsigned_short> local_d4;
  same_endian<unsigned_short,_unsigned_short> local_d2;
  same_endian<unsigned_int,_unsigned_int> local_d0;
  same_endian<unsigned_short,_unsigned_short> local_cc;
  undefined1 local_ca [2];
  undefined1 auStack_c8 [4];
  undefined1 auStack_c4 [4];
  undefined1 auStack_c0 [4];
  undefined1 auStack_bc [4];
  undefined1 auStack_b8 [4];
  undefined1 auStack_b4 [4];
  undefined1 auStack_b0 [2];
  undefined1 auStack_ae [2];
  undefined1 auStack_ac [4];
  undefined1 auStack_a8 [4];
  undefined1 auStack_a4 [4];
  undefined1 auStack_a0 [4];
  undefined1 auStack_9c [4];
  undefined1 auStack_98 [4];
  undefined1 auStack_94 [4];
  undefined1 auStack_90 [4];
  undefined1 auStack_8c [4];
  undefined1 auStack_88 [4];
  undefined1 auStack_84 [4];
  undefined1 auStack_80 [36];
  undefined1 auStack_5c [4];
  undefined1 auStack_58 [4];
  undefined1 auStack_54 [4];
  undefined1 auStack_50 [4];
  undefined1 auStack_4c [4];
  undefined1 auStack_48 [4];
  undefined1 auStack_44 [4];
  size_t local_40;
  size_t header_size;
  size_t row_padding_bytes_local;
  size_t pixel_bytes_local;
  ssize_t sStack_20;
  bool has_alpha_local;
  ssize_t height_local;
  ssize_t width_local;
  WindowsBitmapHeader *header_local;
  
  lVar2 = 0x28;
  if (has_alpha) {
    lVar2 = 0x7c;
  }
  local_40 = lVar2 + 0xe;
  header_size = row_padding_bytes;
  row_padding_bytes_local = pixel_bytes;
  pixel_bytes_local._7_1_ = has_alpha;
  sStack_20 = height;
  height_local = width;
  width_local = (ssize_t)header;
  memset(local_ca,0,2);
  memset(auStack_c8,0,4);
  local_120 = auStack_c4;
  do {
    memset(local_120,0,2);
    local_120 = local_120 + 2;
  } while (local_120 != auStack_c0);
  memset(auStack_c0,0,4);
  memset(auStack_bc,0,4);
  memset(auStack_b8,0,4);
  memset(auStack_b4,0,4);
  memset(auStack_b0,0,2);
  memset(auStack_ae,0,2);
  memset(auStack_ac,0,4);
  memset(auStack_a8,0,4);
  memset(auStack_a4,0,4);
  memset(auStack_a0,0,4);
  memset(auStack_9c,0,4);
  memset(auStack_98,0,4);
  memset(auStack_94,0,4);
  memset(auStack_90,0,4);
  memset(auStack_8c,0,4);
  memset(auStack_88,0,4);
  memset(auStack_84,0,4);
  memset(auStack_80,0,0x24);
  memset(auStack_5c,0,4);
  memset(auStack_58,0,4);
  memset(auStack_54,0,4);
  memset(auStack_50,0,4);
  memset(auStack_4c,0,4);
  memset(auStack_48,0,4);
  memset(auStack_44,0,4);
  memcpy((void *)width_local,local_ca,0x8a);
  little_endian<unsigned_short,_unsigned_short>::converted_endian
            ((little_endian<unsigned_short,_unsigned_short> *)&local_cc,0x4d42);
  *(converted_endian<unsigned_short,_unsigned_short,_phosg::ident_st<unsigned_short,_unsigned_short>,_phosg::ident_st<unsigned_short,_unsigned_short>_>
    *)width_local =
       local_cc.
       super_converted_endian<unsigned_short,_unsigned_short,_phosg::ident_st<unsigned_short,_unsigned_short>,_phosg::ident_st<unsigned_short,_unsigned_short>_>
       .value;
  little_endian<unsigned_int,_unsigned_int>::converted_endian
            ((little_endian<unsigned_int,_unsigned_int> *)&local_d0,
             (int)local_40 + (int)height_local * (int)sStack_20 * (int)row_padding_bytes_local +
             (int)header_size * (int)sStack_20);
  ((converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
    *)(width_local + 2))->value =
       (uint)local_d0.
             super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
             .value;
  little_endian<unsigned_short,_unsigned_short>::converted_endian
            ((little_endian<unsigned_short,_unsigned_short> *)&local_d2,0);
  ((converted_endian<unsigned_short,_unsigned_short,_phosg::ident_st<unsigned_short,_unsigned_short>,_phosg::ident_st<unsigned_short,_unsigned_short>_>
    *)(width_local + 6))->value =
       (unsigned_short)
       local_d2.
       super_converted_endian<unsigned_short,_unsigned_short,_phosg::ident_st<unsigned_short,_unsigned_short>,_phosg::ident_st<unsigned_short,_unsigned_short>_>
       .value;
  little_endian<unsigned_short,_unsigned_short>::converted_endian
            ((little_endian<unsigned_short,_unsigned_short> *)&local_d4,0);
  ((converted_endian<unsigned_short,_unsigned_short,_phosg::ident_st<unsigned_short,_unsigned_short>,_phosg::ident_st<unsigned_short,_unsigned_short>_>
    *)(width_local + 8))->value =
       (unsigned_short)
       local_d4.
       super_converted_endian<unsigned_short,_unsigned_short,_phosg::ident_st<unsigned_short,_unsigned_short>,_phosg::ident_st<unsigned_short,_unsigned_short>_>
       .value;
  little_endian<unsigned_int,_unsigned_int>::converted_endian
            ((little_endian<unsigned_int,_unsigned_int> *)&local_d8,(uint)local_40);
  ((converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
    *)(width_local + 10))->value =
       (uint)local_d8.
             super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
             .value;
  little_endian<unsigned_int,_unsigned_int>::converted_endian
            ((little_endian<unsigned_int,_unsigned_int> *)&local_dc,(int)local_40 - 0xe);
  ((converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
    *)(width_local + 0xe))->value =
       (uint)local_dc.
             super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
             .value;
  little_endian<int,_int>::converted_endian((little_endian<int,_int> *)&local_e0,(int)height_local);
  ((converted_endian<int,_int,_phosg::ident_st<int,_int>,_phosg::ident_st<int,_int>_> *)
  (width_local + 0x12))->value =
       (int)local_e0.
            super_converted_endian<int,_int,_phosg::ident_st<int,_int>,_phosg::ident_st<int,_int>_>.
            value;
  little_endian<int,_int>::converted_endian((little_endian<int,_int> *)&local_e4,(int)sStack_20);
  ((converted_endian<int,_int,_phosg::ident_st<int,_int>,_phosg::ident_st<int,_int>_> *)
  (width_local + 0x16))->value =
       (int)local_e4.
            super_converted_endian<int,_int,_phosg::ident_st<int,_int>,_phosg::ident_st<int,_int>_>.
            value;
  little_endian<unsigned_short,_unsigned_short>::converted_endian
            ((little_endian<unsigned_short,_unsigned_short> *)&local_e6,1);
  ((converted_endian<unsigned_short,_unsigned_short,_phosg::ident_st<unsigned_short,_unsigned_short>,_phosg::ident_st<unsigned_short,_unsigned_short>_>
    *)(width_local + 0x1a))->value =
       (unsigned_short)
       local_e6.
       super_converted_endian<unsigned_short,_unsigned_short,_phosg::ident_st<unsigned_short,_unsigned_short>,_phosg::ident_st<unsigned_short,_unsigned_short>_>
       .value;
  uVar1 = 0x18;
  if ((pixel_bytes_local._7_1_ & 1) != 0) {
    uVar1 = 0x20;
  }
  little_endian<unsigned_short,_unsigned_short>::converted_endian
            ((little_endian<unsigned_short,_unsigned_short> *)&local_e8,uVar1);
  ((converted_endian<unsigned_short,_unsigned_short,_phosg::ident_st<unsigned_short,_unsigned_short>,_phosg::ident_st<unsigned_short,_unsigned_short>_>
    *)(width_local + 0x1c))->value =
       (unsigned_short)
       local_e8.
       super_converted_endian<unsigned_short,_unsigned_short,_phosg::ident_st<unsigned_short,_unsigned_short>,_phosg::ident_st<unsigned_short,_unsigned_short>_>
       .value;
  uVar3 = 0;
  if ((pixel_bytes_local._7_1_ & 1) != 0) {
    uVar3 = 3;
  }
  little_endian<unsigned_int,_unsigned_int>::converted_endian
            ((little_endian<unsigned_int,_unsigned_int> *)&local_ec,uVar3);
  ((converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
    *)(width_local + 0x1e))->value =
       (uint)local_ec.
             super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
             .value;
  if ((pixel_bytes_local._7_1_ & 1) == 0) {
    local_148 = 0;
  }
  else {
    local_148 = (int)height_local * (int)sStack_20 * 4;
  }
  little_endian<unsigned_int,_unsigned_int>::converted_endian
            ((little_endian<unsigned_int,_unsigned_int> *)&local_f0,local_148);
  ((converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
    *)(width_local + 0x22))->value =
       (uint)local_f0.
             super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
             .value;
  little_endian<int,_int>::converted_endian((little_endian<int,_int> *)&local_f4,0xb12);
  ((converted_endian<int,_int,_phosg::ident_st<int,_int>,_phosg::ident_st<int,_int>_> *)
  (width_local + 0x26))->value =
       (int)local_f4.
            super_converted_endian<int,_int,_phosg::ident_st<int,_int>,_phosg::ident_st<int,_int>_>.
            value;
  little_endian<int,_int>::converted_endian((little_endian<int,_int> *)&local_f8,0xb12);
  ((converted_endian<int,_int,_phosg::ident_st<int,_int>,_phosg::ident_st<int,_int>_> *)
  (width_local + 0x2a))->value =
       (int)local_f8.
            super_converted_endian<int,_int,_phosg::ident_st<int,_int>,_phosg::ident_st<int,_int>_>.
            value;
  little_endian<unsigned_int,_unsigned_int>::converted_endian
            ((little_endian<unsigned_int,_unsigned_int> *)&local_fc,0);
  ((converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
    *)(width_local + 0x2e))->value =
       (uint)local_fc.
             super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
             .value;
  little_endian<unsigned_int,_unsigned_int>::converted_endian
            ((little_endian<unsigned_int,_unsigned_int> *)&local_100,0);
  ((converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
    *)(width_local + 0x32))->value =
       (uint)local_100.
             super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
             .value;
  if ((pixel_bytes_local._7_1_ & 1) != 0) {
    little_endian<unsigned_int,_unsigned_int>::converted_endian
              ((little_endian<unsigned_int,_unsigned_int> *)&local_104,0xff);
    ((converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
      *)(width_local + 0x36))->value =
         (uint)local_104.
               super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
               .value;
    little_endian<unsigned_int,_unsigned_int>::converted_endian
              ((little_endian<unsigned_int,_unsigned_int> *)&local_108,0xff00);
    ((converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
      *)(width_local + 0x3a))->value =
         (uint)local_108.
               super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
               .value;
    little_endian<unsigned_int,_unsigned_int>::converted_endian
              ((little_endian<unsigned_int,_unsigned_int> *)&local_10c,0xff0000);
    ((converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
      *)(width_local + 0x3e))->value =
         (uint)local_10c.
               super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
               .value;
    little_endian<unsigned_int,_unsigned_int>::converted_endian
              ((little_endian<unsigned_int,_unsigned_int> *)&local_110,0xff000000);
    ((converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
      *)(width_local + 0x42))->value =
         (uint)local_110.
               super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
               .value;
    little_endian<unsigned_int,_unsigned_int>::converted_endian
              ((little_endian<unsigned_int,_unsigned_int> *)&local_114,0x73524742);
    ((converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
      *)(width_local + 0x46))->value =
         (uint)local_114.
               super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
               .value;
    little_endian<unsigned_int,_unsigned_int>::converted_endian
              ((little_endian<unsigned_int,_unsigned_int> *)&local_118,8);
    ((converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
      *)(width_local + 0x7a))->value =
         (uint)local_118.
               super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
               .value;
  }
  return local_40;
}

Assistant:

static size_t init_bmp_header(WindowsBitmapHeader& header,
    ssize_t width, ssize_t height, bool has_alpha,
    size_t pixel_bytes, size_t row_padding_bytes) {
  size_t header_size = sizeof(WindowsBitmapFileHeader) + (has_alpha ? sizeof(WindowsBitmapInfoHeader) : WindowsBitmapInfoHeader::SIZE24);

  // Clear header so we don't have initialize fields that are 0
  header = {};
  header.file_header.magic = 0x4D42; // 'BM'
  header.file_header.file_size = header_size + (width * height * pixel_bytes) + (row_padding_bytes * height);
  header.file_header.reserved[0] = 0;
  header.file_header.reserved[1] = 0;
  header.file_header.data_offset = header_size;
  header.info_header.header_size = header_size - sizeof(WindowsBitmapFileHeader);
  header.info_header.width = width;
  header.info_header.height = height;
  header.info_header.num_planes = 1;
  header.info_header.bit_depth = has_alpha ? 32 : 24;
  header.info_header.compression = has_alpha ? 3 : 0; // BI_BITFIELDS or BI_RGB
  header.info_header.image_size = has_alpha ? (width * height * 4) : 0; // 0 acceptable for BI_RGB
  header.info_header.x_pixels_per_meter = 0x00000B12;
  header.info_header.y_pixels_per_meter = 0x00000B12;
  header.info_header.num_used_colors = 0;
  header.info_header.num_important_colors = 0;
  if (has_alpha) {
    // Write V5 header
    header.info_header.bitmask_r = 0x000000FF;
    header.info_header.bitmask_g = 0x0000FF00;
    header.info_header.bitmask_b = 0x00FF0000;
    header.info_header.bitmask_a = 0xFF000000;
    header.info_header.color_space_type = 0x73524742; // LCS_sRGB / 'sRGB'
    header.info_header.render_intent = 8; // LCS_GM_ABS_COLORIMETRIC
  }

  return header_size;
}